

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void delds(int D,int s,double *C)

{
  double *B;
  double *A;
  long lVar1;
  ulong uVar2;
  long lVar3;
  uint lB;
  int lA;
  
  lB = s + 1;
  B = (double *)malloc((long)(int)lB << 3);
  A = (double *)malloc((long)(s * D) * 8 + 8);
  if (-1 < s) {
    memset(B,0,(ulong)lB << 3);
  }
  *B = 1.0;
  lVar1 = (long)s;
  B[lVar1] = -1.0;
  *A = 1.0;
  if (0 < D) {
    uVar2 = (ulong)(uint)D;
    lA = 1;
    lVar3 = lVar1;
    do {
      poly(A,B,C,lA,lB);
      if (-1 < lVar3) {
        memcpy(A,C,(ulong)(uint)(lA + s) << 3);
      }
      lA = lA + s;
      lVar3 = lVar3 + lVar1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  free(B);
  free(A);
  return;
}

Assistant:

void delds(int D, int s, double *C) {
	int i,j;
	double *vec,*oup;
	/*
	 * delds returns coefficients of [1,....(s-1) zeroes,.. -1]^D
	 * eg., D =1 s = 4 yields
	 * [1,0,0,0,-1]
	 * D=2 s=4 -> [1,0,0,0,-2,0,0,0,1]
	 */ 
	/*
	 * s - seasonal component
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when seasonal component is present. D = 0 means no
	 * seasonal component
	 */ 
	vec = (double*) malloc(sizeof(double) * (s+1));
	oup = (double*) malloc(sizeof(double) * (D*s + 1));
	for(i = 0; i < s+1; ++i) {
		vec[i] = 0.;
	}
	vec[0] = 1.0;
	vec[s] = -1.0;
	oup[0] = 1.0;
	
	for(i = 0; i < D; ++i) {
		poly(oup,vec,C,i*s+1,s+1);
		for(j = 0; j < s*(i+1)+1; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}